

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

bool __thiscall Ptex::v2_2::PtexReader::reopenFP(PtexReader *this)

{
  int iVar1;
  undefined4 extraout_var;
  uint32_t size;
  char *error;
  ExtHeader extheaderval;
  Header headerval;
  
  if (this->_fp != (Handle)0x0) {
    return true;
  }
  iVar1 = (*this->_io->_vptr_PtexInputHandler[2])(this->_io,(this->_path)._M_dataplus._M_p);
  this->_fp = (Handle)CONCAT44(extraout_var,iVar1);
  if ((Handle)CONCAT44(extraout_var,iVar1) == (Handle)0x0) {
    error = "Can\'t reopen";
  }
  else {
    this->_pos = 0;
    readBlock(this,&headerval,0x40,true);
    extheaderval.ubordermode = 0;
    extheaderval.pad = 0;
    extheaderval.vbordermode = 0;
    extheaderval.edgefiltermode = 0;
    extheaderval.lmdheaderzipsize = 0;
    extheaderval.lmdheadermemsize = 0;
    extheaderval.lmddatasize = 0;
    extheaderval.editdatasize = 0;
    extheaderval.editdatapos = 0;
    size = 0x28;
    if (headerval.extheadersize < 0x28) {
      size = headerval.extheadersize;
    }
    readBlock(this,&extheaderval,size,true);
    iVar1 = bcmp(&headerval,&this->_header,0x40);
    if ((iVar1 == 0) && (iVar1 = bcmp(&extheaderval,&this->_extheader,0x28), iVar1 == 0)) {
      LOCK();
      this->_opens = this->_opens + 1;
      UNLOCK();
      return true;
    }
    error = "Header mismatch on reopen of";
  }
  setError(this,error);
  return false;
}

Assistant:

bool PtexReader::reopenFP()
{
    if (_fp) return true;

    // we assume this is called lazily in a scope where readlock is already held
    _fp = _io->open(_path.c_str());
    if (!_fp) {
        setError("Can't reopen");
        return false;
    }
    _pos = 0;
    Header headerval;
    ExtHeader extheaderval;
    readBlock(&headerval, HeaderSize);
    memset(&extheaderval, 0, sizeof(extheaderval));
    readBlock(&extheaderval, PtexUtils::min(uint32_t(ExtHeaderSize), headerval.extheadersize));
    if (0 != memcmp(&headerval, &_header, sizeof(headerval)) ||
        0 != memcmp(&extheaderval, &_extheader, sizeof(extheaderval)))
    {
        setError("Header mismatch on reopen of");
        return false;
    }
    logOpen();
    return true;
}